

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O3

xzFile xz_open(char *path,int fd,char *mode)

{
  xmlMallocFunc p_Var1;
  void *pvVar2;
  size_t sVar3;
  char *__dest;
  __off64_t _Var4;
  
  pvVar2 = (*xmlMalloc)(0x1b0);
  if (pvVar2 != (void *)0x0) {
    *(undefined8 *)((long)pvVar2 + 0x18) = 0x200000000000;
    *(undefined8 *)((long)pvVar2 + 0x68) = 0;
    *(undefined4 *)((long)pvVar2 + 0x70) = 0;
    p_Var1 = xmlMalloc;
    sVar3 = strlen(path);
    __dest = (char *)(*p_Var1)(sVar3 + 1);
    *(char **)((long)pvVar2 + 8) = __dest;
    if (__dest != (char *)0x0) {
      strcpy(__dest,path);
      if (fd == -1) {
        fd = open64(path,0,0x1b6);
        *(int *)((long)pvVar2 + 4) = fd;
        if (fd == -1) {
          (*xmlFree)(*(void **)((long)pvVar2 + 8));
          (*xmlFree)(pvVar2);
          return (xzFile)0x0;
        }
      }
      else {
        *(int *)((long)pvVar2 + 4) = fd;
      }
      _Var4 = lseek64(fd,0,1);
      if (_Var4 == -1) {
        _Var4 = 0;
      }
      *(__off64_t *)((long)pvVar2 + 0x40) = _Var4;
      *(undefined8 *)((long)pvVar2 + 0x38) = 0;
      *(undefined8 *)((long)pvVar2 + 0x50) = 0x100000000;
      *(undefined4 *)((long)pvVar2 + 0x60) = 0;
      if (*(void **)((long)pvVar2 + 0x68) != (void *)0x0) {
        if (*(int *)((long)pvVar2 + 100) != 5) {
          (*xmlFree)(*(void **)((long)pvVar2 + 0x68));
        }
        *(undefined8 *)((long)pvVar2 + 0x68) = 0;
      }
      *(undefined4 *)((long)pvVar2 + 100) = 0;
      *(undefined8 *)((long)pvVar2 + 0x10) = 0;
      *(undefined8 *)((long)pvVar2 + 0x80) = 0;
      *(undefined4 *)((long)pvVar2 + 0x128) = 0;
      return pvVar2;
    }
    (*xmlFree)(pvVar2);
  }
  return (xzFile)0x0;
}

Assistant:

static xzFile
xz_open(const char *path, int fd, const char *mode ATTRIBUTE_UNUSED)
{
    xz_statep state;

    /* allocate xzFile structure to return */
    state = xmlMalloc(sizeof(xz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = BUFSIZ;       /* requested buffer size */
    state->msg = NULL;          /* no error message yet */
    state->init = 0;            /* initialization of zlib data */

    /* save the path name for error messages */
    state->path = xmlMalloc(strlen(path) + 1);
    if (state->path == NULL) {
        xmlFree(state);
        return NULL;
    }
    strcpy(state->path, path);

    /* open the file with the appropriate mode (or just use fd) */
    state->fd = fd != -1 ? fd : open(path,
#ifdef O_LARGEFILE
                                     O_LARGEFILE |
#endif
#ifdef O_BINARY
                                     O_BINARY |
#endif
                                     O_RDONLY, 0666);
    if (state->fd == -1) {
        xmlFree(state->path);
        xmlFree(state);
        return NULL;
    }

    /* save the current position for rewinding (only if reading) */
    state->start = lseek(state->fd, 0, SEEK_CUR);
    if (state->start == (uint64_t) - 1)
        state->start = 0;

    /* initialize stream */
    xz_reset(state);

    /* return stream */
    return (xzFile) state;
}